

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

void __thiscall
flatbuffers::ts::TsGenerator::GenStructArgs
          (TsGenerator *this,import_set *imports,StructDef *struct_def,string *arguments,
          string *nameprefix)

{
  FieldDef *owner;
  StructDef *struct_def_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer ppFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (ppFVar1 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
    owner = *ppFVar1;
    if (((owner->value).type.base_type == BASE_TYPE_STRUCT) &&
       (struct_def_00 = (owner->value).type.struct_def, struct_def_00->fixed == true)) {
      std::operator+(&local_d0,nameprefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)owner);
      std::operator+(&local_70,&local_d0,"_");
      GenStructArgs(this,imports,struct_def_00,arguments,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_d0;
    }
    else {
      std::operator+(&local_90,", ",nameprefix);
      std::operator+(&local_50,&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)owner);
      std::operator+(&local_d0,&local_50,": ");
      GenTypeName(&local_b0,this,imports,&owner->super_Definition,&(owner->value).type,true,
                  owner->presence == kOptional);
      std::operator+(&local_70,&local_d0,&local_b0);
      std::__cxx11::string::append((string *)arguments);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = &local_90;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return;
}

Assistant:

void GenStructArgs(import_set &imports, const StructDef &struct_def,
                     std::string *arguments, const std::string &nameprefix) {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        GenStructArgs(imports, *field.value.type.struct_def, arguments,
                      nameprefix + field.name + "_");
      } else {
        *arguments += ", " + nameprefix + field.name + ": " +
                      GenTypeName(imports, field, field.value.type, true,
                                  field.IsOptional());
      }
    }
  }